

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_utils.h
# Opt level: O0

int timeval_comp(timeval *x,timeval *y)

{
  timeval *y_local;
  timeval *x_local;
  
  timeval_align(x);
  timeval_align(y);
  if (x->tv_sec < y->tv_sec) {
    x_local._4_4_ = -1;
  }
  else if (y->tv_sec < x->tv_sec) {
    x_local._4_4_ = 1;
  }
  else if (x->tv_usec < y->tv_usec) {
    x_local._4_4_ = -1;
  }
  else if (y->tv_usec < x->tv_usec) {
    x_local._4_4_ = 1;
  }
  else {
    x_local._4_4_ = 0;
  }
  return x_local._4_4_;
}

Assistant:

inline static int timeval_comp(struct timeval *x, struct timeval *y) {
    timeval_align(x);
    timeval_align(y);
    if (x->tv_sec < y->tv_sec) {
        return -1;
    } else if (x->tv_sec > y->tv_sec) {
        return 1;
    } else if (x->tv_usec < y->tv_usec) {
        return -1;
    } else if (x->tv_usec > y->tv_usec) {
        return 1;
    } else {
        return 0;
    }
}